

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

FT_Error tt_face_vary_cvt(TT_Face face,FT_Stream stream)

{
  FT_Memory memory;
  GX_Blend blend;
  FT_UShort FVar1;
  FT_UShort FVar2;
  FT_Error FVar3;
  FT_ULong FVar4;
  FT_Fixed *__dest;
  FT_UShort *P;
  uchar *puVar5;
  FT_Fixed FVar6;
  ulong uVar7;
  FT_UShort *P_00;
  uchar *puVar8;
  long lVar9;
  FT_UShort *pFVar10;
  FT_UInt delta_cnt;
  ulong uVar11;
  FT_Fixed *P_01;
  uint uVar12;
  FT_Fixed *P_02;
  FT_Error local_ac;
  FT_UShort *local_a8;
  FT_Fixed *local_a0;
  FT_UShort local_92;
  FT_Fixed *local_90;
  ulong local_88;
  FT_UInt spoint_count;
  FT_UInt point_count;
  FT_UShort *local_78;
  FT_ULong table_len;
  uchar *local_68;
  FT_Fixed *local_60;
  FT_Fixed local_58;
  ulong local_50;
  FT_UShort *local_48;
  uchar *local_40;
  ulong local_38;
  
  memory = stream->memory;
  blend = face->blend;
  spoint_count = 0;
  if ((((blend == (GX_Blend)0x0) || (face->cvt == (FT_Short *)0x0)) ||
      (FVar3 = (*face->goto_table)(face,0x63766172,stream,&table_len), FVar3 != 0)) ||
     (local_ac = FT_Stream_EnterFrame(stream,table_len), local_ac != 0)) {
    local_ac = 0;
    __dest = (FT_Fixed *)0x0;
    P = (FT_UShort *)0x0;
    P_01 = (FT_Fixed *)0x0;
    P_02 = (FT_Fixed *)0x0;
  }
  else {
    puVar8 = stream->cursor;
    puVar5 = stream->base;
    FVar4 = FT_Stream_GetULong(stream);
    if (FVar4 == 0x10000) {
      local_88 = (long)puVar8 - (long)puVar5;
      __dest = (FT_Fixed *)ft_mem_realloc(memory,8,0,(ulong)blend->num_axis,(void *)0x0,&local_ac);
      if (local_ac == 0) {
        local_a0 = (FT_Fixed *)
                   ft_mem_realloc(memory,8,0,(ulong)blend->num_axis,(void *)0x0,&local_ac);
        if (local_ac == 0) {
          P = (FT_UShort *)0x0;
          local_90 = (FT_Fixed *)
                     ft_mem_realloc(memory,8,0,(ulong)blend->num_axis,(void *)0x0,&local_ac);
          P_01 = local_a0;
          P_02 = local_90;
          if (local_ac == 0) {
            FVar1 = FT_Stream_GetUShort(stream);
            FVar2 = FT_Stream_GetUShort(stream);
            local_50 = (ulong)(FVar1 & 0xfff);
            if (table_len < (ulong)FVar2 + local_50 * 4) {
              local_ac = 8;
              P = (FT_UShort *)0x0;
              P_01 = local_a0;
              P_02 = local_90;
            }
            else {
              local_88 = local_88 + FVar2;
              local_60 = __dest;
              if ((short)FVar1 < 0) {
                puVar8 = stream->base;
                uVar11 = (long)stream->cursor - (long)puVar8;
                puVar5 = puVar8 + local_88;
                if ((ulong)((long)stream->limit - (long)puVar8) <= local_88) {
                  puVar5 = stream->limit;
                }
                stream->cursor = puVar5;
                P = ft_var_readpackedpoints(stream,table_len,&spoint_count);
                puVar8 = stream->base;
                local_88 = (long)stream->cursor - (long)puVar8;
                puVar5 = puVar8 + uVar11;
                if ((ulong)((long)stream->limit - (long)puVar8) <= uVar11) {
                  puVar5 = stream->limit;
                }
                stream->cursor = puVar5;
              }
              else {
                P = (FT_UShort *)0x0;
              }
              local_78 = (FT_UShort *)0x0;
              uVar11 = 0;
              __dest = local_60;
              while (P_01 = local_a0, P_02 = local_90, (int)uVar11 != (int)local_50) {
                local_38 = uVar11;
                local_92 = FT_Stream_GetUShort(stream);
                FVar1 = FT_Stream_GetUShort(stream);
                local_a8 = (FT_UShort *)CONCAT44(local_a8._4_4_,(uint)FVar1);
                if ((short)FVar1 < 0) {
                  for (uVar11 = 0; uVar11 < blend->num_axis; uVar11 = uVar11 + 1) {
                    FVar1 = FT_Stream_GetUShort(stream);
                    local_60[uVar11] = (long)((int)(short)FVar1 << 2);
                  }
                }
                else {
                  uVar12 = FVar1 & 0xfff;
                  if (blend->tuplecount <= uVar12) {
                    local_ac = 8;
                    P_01 = local_a0;
                    P_02 = local_90;
                    goto LAB_001686fb;
                  }
                  memcpy(__dest,blend->tuplecoords + uVar12 * blend->num_axis,
                         (ulong)blend->num_axis << 3);
                }
                if (((uint)local_a8 >> 0xe & 1) != 0) {
                  for (uVar11 = 0; uVar7 = (ulong)blend->num_axis, uVar11 < uVar7;
                      uVar11 = uVar11 + 1) {
                    FVar1 = FT_Stream_GetUShort(stream);
                    local_a0[uVar11] = (long)((int)(short)FVar1 << 2);
                  }
                  for (uVar11 = 0; uVar11 < uVar7; uVar11 = uVar11 + 1) {
                    FVar1 = FT_Stream_GetUShort(stream);
                    local_90[uVar11] = (long)((int)(short)FVar1 << 2);
                    uVar7 = (ulong)blend->num_axis;
                  }
                }
                __dest = local_60;
                FVar6 = ft_var_apply_tuple(blend,(FT_UShort)local_a8,local_60,local_a0,local_90);
                if (FVar6 != 0) {
                  local_40 = stream->base;
                  local_68 = stream->cursor;
                  puVar8 = local_40 + local_88;
                  if ((ulong)((long)stream->limit - (long)local_40) <= local_88) {
                    puVar8 = stream->limit;
                  }
                  stream->cursor = puVar8;
                  local_58 = FVar6;
                  if (((uint)local_a8 >> 0xd & 1) == 0) {
                    point_count = spoint_count;
                    local_48 = P;
                  }
                  else {
                    local_48 = ft_var_readpackedpoints(stream,table_len,&point_count);
                    local_78 = local_48;
                  }
                  local_a8 = (FT_UShort *)CONCAT44(local_a8._4_4_,point_count);
                  delta_cnt = point_count;
                  if (point_count == 0) {
                    delta_cnt = (FT_UInt)face->cvt_size;
                  }
                  P_00 = (FT_UShort *)ft_var_readpackeddeltas(stream,table_len,delta_cnt);
                  if ((local_48 == (FT_UShort *)0x0) || (P_00 == (FT_UShort *)0x0)) {
LAB_001689e6:
                    pFVar10 = (FT_UShort *)0xffffffffffffffff;
                    if (local_78 != (FT_UShort *)0xffffffffffffffff) {
                      local_a8 = P_00;
                      ft_mem_free(memory,local_78);
                      pFVar10 = (FT_UShort *)0x0;
                      P_00 = local_a8;
                    }
                  }
                  else {
                    if (local_78 != (FT_UShort *)0xffffffffffffffff) {
                      for (uVar11 = 0; ((ulong)local_a8 & 0xffffffff) != uVar11; uVar11 = uVar11 + 1
                          ) {
                        if ((ulong)local_48[uVar11] < face->cvt_size) {
                          face->cvt[local_48[uVar11]] =
                               face->cvt[local_48[uVar11]] +
                               (short)((uint)((int)((long)((FT_Short *)P_00)[uVar11] *
                                                   (long)(int)local_58) +
                                              (int)((long)((FT_Short *)P_00)[uVar11] *
                                                    (long)(int)local_58 >> 0x3f) + 0x8000) >> 0x10);
                        }
                      }
                      goto LAB_001689e6;
                    }
                    pFVar10 = (FT_UShort *)0xffffffffffffffff;
                    if (face->cvt_size == ((ulong)local_a8 & 0xffffffff)) {
                      for (lVar9 = 0; (uint)lVar9 < (uint)local_a8; lVar9 = lVar9 + 1) {
                        face->cvt[lVar9] =
                             face->cvt[lVar9] +
                             (short)((uint)((int)((long)((FT_Short *)P_00)[lVar9] *
                                                 (long)(int)local_58) +
                                            (int)((long)((FT_Short *)P_00)[lVar9] *
                                                  (long)(int)local_58 >> 0x3f) + 0x8000) >> 0x10);
                      }
                      goto LAB_001689e6;
                    }
                  }
                  local_68 = (uchar *)((long)local_68 - (long)local_40);
                  local_a8 = pFVar10;
                  ft_mem_free(memory,P_00);
                  puVar8 = stream->base + (long)local_68;
                  if ((ulong)((long)stream->limit - (long)stream->base) <= local_68) {
                    puVar8 = stream->limit;
                  }
                  stream->cursor = puVar8;
                  local_78 = local_a8;
                }
                local_88 = local_88 + local_92;
                uVar11 = (ulong)((int)local_38 + 1);
              }
            }
          }
        }
        else {
          P = (FT_UShort *)0x0;
          P_01 = local_a0;
          P_02 = (FT_Fixed *)0x0;
        }
      }
      else {
        P = (FT_UShort *)0x0;
        P_01 = (FT_Fixed *)0x0;
        P_02 = (FT_Fixed *)0x0;
      }
    }
    else {
      local_ac = 0;
      P = (FT_UShort *)0x0;
      __dest = (FT_Fixed *)0x0;
      P_01 = (FT_Fixed *)0x0;
      P_02 = (FT_Fixed *)0x0;
    }
    FT_Stream_ExitFrame(stream);
LAB_001686fb:
    if (P == (FT_UShort *)0xffffffffffffffff) goto LAB_001685b9;
  }
  ft_mem_free(memory,P);
LAB_001685b9:
  ft_mem_free(memory,__dest);
  ft_mem_free(memory,P_01);
  ft_mem_free(memory,P_02);
  return local_ac;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_vary_cvt( TT_Face    face,
                    FT_Stream  stream )
  {
    FT_Error    error;
    FT_Memory   memory = stream->memory;
    FT_ULong    table_start;
    FT_ULong    table_len;
    FT_UInt     tupleCount;
    FT_ULong    offsetToData;
    FT_ULong    here;
    FT_UInt     i, j;
    FT_Fixed*   tuple_coords    = NULL;
    FT_Fixed*   im_start_coords = NULL;
    FT_Fixed*   im_end_coords   = NULL;
    GX_Blend    blend           = face->blend;
    FT_UInt     point_count, spoint_count = 0;
    FT_UShort*  sharedpoints = NULL;
    FT_UShort*  localpoints  = NULL;
    FT_UShort*  points;
    FT_Short*   deltas;


    FT_TRACE2(( "CVAR " ));

    if ( !blend )
    {
      FT_TRACE2(( "\n"
                  "tt_face_vary_cvt: no blend specified\n" ));
      error = FT_Err_Ok;
      goto Exit;
    }

    if ( !face->cvt )
    {
      FT_TRACE2(( "\n"
                  "tt_face_vary_cvt: no `cvt ' table\n" ));
      error = FT_Err_Ok;
      goto Exit;
    }

    error = face->goto_table( face, TTAG_cvar, stream, &table_len );
    if ( error )
    {
      FT_TRACE2(( "is missing\n" ));

      error = FT_Err_Ok;
      goto Exit;
    }

    if ( FT_FRAME_ENTER( table_len ) )
    {
      error = FT_Err_Ok;
      goto Exit;
    }

    table_start = FT_Stream_FTell( stream );
    if ( FT_GET_LONG() != 0x00010000L )
    {
      FT_TRACE2(( "bad table version\n" ));

      error = FT_Err_Ok;
      goto FExit;
    }

    FT_TRACE2(( "loaded\n" ));

    if ( FT_NEW_ARRAY( tuple_coords, blend->num_axis )    ||
         FT_NEW_ARRAY( im_start_coords, blend->num_axis ) ||
         FT_NEW_ARRAY( im_end_coords, blend->num_axis )   )
      goto FExit;

    tupleCount   = FT_GET_USHORT();
    offsetToData = FT_GET_USHORT();

    /* rough sanity test */
    if ( offsetToData + ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) * 4 >
           table_len )
    {
      FT_TRACE2(( "tt_face_vary_cvt:"
                  " invalid CVT variation array header\n" ));

      error = FT_THROW( Invalid_Table );
      goto FExit;
    }

    offsetToData += table_start;

    if ( tupleCount & GX_TC_TUPLES_SHARE_POINT_NUMBERS )
    {
      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      sharedpoints = ft_var_readpackedpoints( stream,
                                              table_len,
                                              &spoint_count );
      offsetToData = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "cvar: there %s %d tuple%s:\n",
                ( tupleCount & 0xFFF ) == 1 ? "is" : "are",
                tupleCount & 0xFFF,
                ( tupleCount & 0xFFF ) == 1 ? "" : "s" ));

    for ( i = 0; i < ( tupleCount & 0xFFF ); i++ )
    {
      FT_UInt   tupleDataSize;
      FT_UInt   tupleIndex;
      FT_Fixed  apply;


      FT_TRACE6(( "  tuple %d:\n", i ));

      tupleDataSize = FT_GET_USHORT();
      tupleIndex    = FT_GET_USHORT();

      if ( tupleIndex & GX_TI_EMBEDDED_TUPLE_COORD )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          tuple_coords[j] = FT_GET_SHORT() * 4;  /* convert from        */
                                                 /* short frac to fixed */
      }
      else if ( ( tupleIndex & GX_TI_TUPLE_INDEX_MASK ) >= blend->tuplecount )
      {
        FT_TRACE2(( "tt_face_vary_cvt:"
                    " invalid tuple index\n" ));

        error = FT_THROW( Invalid_Table );
        goto Exit;
      }
      else
        FT_MEM_COPY(
          tuple_coords,
          &blend->tuplecoords[( tupleIndex & 0xFFF ) * blend->num_axis],
          blend->num_axis * sizeof ( FT_Fixed ) );

      if ( tupleIndex & GX_TI_INTERMEDIATE_TUPLE )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          im_start_coords[j] = FT_GET_SHORT() * 4;
        for ( j = 0; j < blend->num_axis; j++ )
          im_end_coords[j] = FT_GET_SHORT() * 4;
      }

      apply = ft_var_apply_tuple( blend,
                                  (FT_UShort)tupleIndex,
                                  tuple_coords,
                                  im_start_coords,
                                  im_end_coords );

      if ( apply == 0 )              /* tuple isn't active for our blend */
      {
        offsetToData += tupleDataSize;
        continue;
      }

      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      if ( tupleIndex & GX_TI_PRIVATE_POINT_NUMBERS )
      {
        localpoints = ft_var_readpackedpoints( stream,
                                               table_len,
                                               &point_count );
        points      = localpoints;
      }
      else
      {
        points      = sharedpoints;
        point_count = spoint_count;
      }

      deltas = ft_var_readpackeddeltas( stream,
                                        table_len,
                                        point_count == 0 ? face->cvt_size
                                                         : point_count );

      if ( !points                                                        ||
           !deltas                                                        ||
           ( localpoints == ALL_POINTS && point_count != face->cvt_size ) )
        ; /* failure, ignore it */

      else if ( localpoints == ALL_POINTS )
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        FT_TRACE7(( "    CVT deltas:\n" ));

        /* this means that there are deltas for every entry in cvt */
        for ( j = 0; j < face->cvt_size; j++ )
        {
          FT_Long  orig_cvt = face->cvt[j];


          face->cvt[j] = (FT_Short)( orig_cvt +
                                     FT_MulFix( deltas[j], apply ) );

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( orig_cvt != face->cvt[j] )
          {
            FT_TRACE7(( "      %d: %d -> %d\n",
                        j, orig_cvt, face->cvt[j] ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      else
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        FT_TRACE7(( "    CVT deltas:\n" ));

        for ( j = 0; j < point_count; j++ )
        {
          int      pindex;
          FT_Long  orig_cvt;


          pindex = points[j];
          if ( (FT_ULong)pindex >= face->cvt_size )
            continue;

          orig_cvt          = face->cvt[pindex];
          face->cvt[pindex] = (FT_Short)( orig_cvt +
                                          FT_MulFix( deltas[j], apply ) );

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( orig_cvt != face->cvt[pindex] )
          {
            FT_TRACE7(( "      %d: %d -> %d\n",
                        pindex, orig_cvt, face->cvt[pindex] ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      if ( localpoints != ALL_POINTS )
        FT_FREE( localpoints );
      FT_FREE( deltas );

      offsetToData += tupleDataSize;

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "\n" ));

  FExit:
    FT_FRAME_EXIT();

  Exit:
    if ( sharedpoints != ALL_POINTS )
      FT_FREE( sharedpoints );
    FT_FREE( tuple_coords );
    FT_FREE( im_start_coords );
    FT_FREE( im_end_coords );

    return error;
  }